

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityIgnore(char *msg,UNITY_UINT line)

{
  UNITY_UINT line_local;
  char *msg_local;
  
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    UnityTestResultsBegin(Unity.TestFile,line);
    UnityPrint("IGNORE");
    if (msg != (char *)0x0) {
      putchar(0x3a);
      putchar(0x20);
      UnityPrint(msg);
    }
    Unity.CurrentTestIgnored = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  return;
}

Assistant:

void UnityIgnore(const char* msg, const UNITY_LINE_TYPE line)
{
    RETURN_IF_FAIL_OR_IGNORE;

    UnityTestResultsBegin(Unity.TestFile, line);
    UnityPrint(UnityStrIgnore);
    if (msg != NULL)
    {
        UNITY_OUTPUT_CHAR(':');
        UNITY_OUTPUT_CHAR(' ');
        UnityPrint(msg);
    }
    UNITY_IGNORE_AND_BAIL;
}